

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleCalculateEdgeLogLikelihoodsByPartition
              (int instance,int *parentBufferIndices,int *childBufferIndices,int *probabilityIndices
              ,int *firstDerivativeIndices,int *secondDerivativeIndices,int *categoryWeightsIndices,
              int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
              int partitionCount,int count,double *outSumLogLikelihoodByPartition,
              double *outSumLogLikelihood,double *outSumFirstDerivativeByPartition,
              double *outSumFirstDerivative,double *outSumSecondDerivativeByPartition,
              double *outSumSecondDerivative)

{
  BeagleImpl *pBVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined4 in_stack_00000028;
  undefined4 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined8 in_stack_00000058;
  undefined8 in_stack_00000060;
  int returnValue;
  BeagleImpl *beagleInstance;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 local_34;
  
  pBVar1 = beagle::getBeagleInstance((int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_34 = -4;
  }
  else {
    local_34 = (**(code **)(*(long *)pBVar1 + 0x168))
                         (pBVar1,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,
                          in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                          in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
                          in_stack_00000050,in_stack_00000058,in_stack_00000060);
  }
  return local_34;
}

Assistant:

int beagleCalculateEdgeLogLikelihoodsByPartition(int instance,
                                                 const int* parentBufferIndices,
                                                 const int* childBufferIndices,
                                                 const int* probabilityIndices,
                                                 const int* firstDerivativeIndices,
                                                 const int* secondDerivativeIndices,
                                                 const int* categoryWeightsIndices,
                                                 const int* stateFrequenciesIndices,
                                                 const int* cumulativeScaleIndices,
                                                 const int* partitionIndices,
                                                 int partitionCount,
                                                 int count,
                                                 double* outSumLogLikelihoodByPartition,
                                                 double* outSumLogLikelihood,
                                                 double* outSumFirstDerivativeByPartition,
                                                 double* outSumFirstDerivative,
                                                 double* outSumSecondDerivativeByPartition,
                                                 double* outSumSecondDerivative) {
    DEBUG_START_TIME();
//    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->calculateEdgeLogLikelihoodsByPartition(
                                                        parentBufferIndices,
                                                        childBufferIndices,
                                                        probabilityIndices,
                                                        firstDerivativeIndices,
                                                        secondDerivativeIndices,
                                                        categoryWeightsIndices,
                                                        stateFrequenciesIndices,
                                                        cumulativeScaleIndices,
                                                        partitionIndices,
                                                        partitionCount,
                                                        count,
                                                        outSumLogLikelihoodByPartition,
                                                        outSumLogLikelihood,
                                                        outSumFirstDerivativeByPartition,
                                                        outSumFirstDerivative,
                                                        outSumSecondDerivativeByPartition,
                                                        outSumSecondDerivative);
        DEBUG_END_TIME();

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
        union {double f; long l;} dfp;
        for(int i=0; i < partitionCount; i++) {
            dfp.f = outSumLogLikelihoodByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumLogLikelihoodByPartition[i] = dfp.f;
            dfp.f = outSumFirstDerivativeByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumFirstDerivativeByPartition[i] = dfp.f;
            dfp.f = outSumSecondDerivativeByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumSecondDerivativeByPartition[i] = dfp.f;
        }
        dfp.f = *outSumLogLikelihood;
        dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
        *outSumLogLikelihood = dfp.f;
#endif


        return returnValue;
//    }
//    catch (std::bad_alloc &) {
//        return BEAGLE_ERROR_OUT_OF_MEMORY;
//    }
//    catch (std::out_of_range &) {
//        return BEAGLE_ERROR_OUT_OF_RANGE;
//    }
//    catch (...) {
//        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
//    }
}